

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

Gia_Man_t * Gia_ManMuxRestructure(Gia_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Vec_Bit_t *p_00;
  int *__s;
  Gia_Man_t *p_01;
  char *pcVar9;
  uint *puVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  uint uVar13;
  int Entry;
  int Entry_00;
  int Entry_01;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  size_t sVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  
  iVar15 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  p_00 = (Vec_Bit_t *)malloc(0x10);
  uVar22 = iVar15 * 0x20;
  p_00->nCap = uVar22;
  if (iVar15 == 0) {
    sVar20 = 0;
    __s = (int *)0x0;
  }
  else {
    sVar20 = (long)iVar15 << 2;
    __s = (int *)malloc(sVar20);
  }
  p_00->pArray = __s;
  p_00->nSize = uVar22;
  memset(__s,0,sVar20);
  if (p->pSibls != (int *)0x0) {
    __assert_fail("!Gia_ManHasChoices(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xee,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("!Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xef,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xf0,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  p_01 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar20 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar20 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_01->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar20 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar20 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_01->pSpec = pcVar9;
  puVar10 = (uint *)calloc((long)p_01->nObjsAlloc,4);
  p_01->pMuxes = puVar10;
  p->pObjs->Value = 0;
  Gia_ManHashStart(p_01);
  uVar14 = (ulong)(uint)p->nObjs;
  if (1 < p->nObjs) {
    lVar21 = 1;
    lVar23 = 0xc;
    do {
      pGVar3 = p->pObjs;
      uVar4 = *(ulong *)(&pGVar3->field_0x0 + lVar23);
      uVar6 = (uint)uVar4;
      if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
        pGVar11 = Gia_ManAppendObj(p_01);
        uVar14 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar14 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar14 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_01->pObjs;
        if ((pGVar11 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar11)) {
LAB_0021deb7:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = p_01->pObjs;
        if ((pGVar11 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar11)) goto LAB_0021deb7;
        *(int *)((long)&pGVar3->Value + lVar23) =
             (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
      }
      else {
        uVar18 = uVar4 & 0x1fffffff;
        iVar15 = (int)uVar18;
        if (uVar18 == 0x1fffffff || -1 < (int)uVar6) {
          uVar19 = uVar6 & 0x1fffffff;
          uVar13 = (uint)(uVar4 >> 0x20);
          uVar16 = uVar13 & 0x1fffffff;
          if ((((int)uVar6 < 0) || (uVar19 == 0x1fffffff)) || (uVar19 != uVar16)) {
            puVar10 = p->pMuxes;
            if ((puVar10 == (uint *)0x0) || (puVar10[lVar21] == 0)) {
              uVar1 = *(uint *)((long)pGVar3 + lVar23 + (ulong)(uint)(iVar15 << 2) * -3 + 8);
              if ((uVar18 == 0x1fffffff || (int)uVar6 < 0) || uVar16 <= uVar19) {
                if (((int)uVar1 < 0) ||
                   (uVar6 = *(uint *)((long)pGVar3 +
                                     lVar23 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3 + 8),
                   (int)uVar6 < 0)) goto LAB_0021ded6;
                iVar15 = Gia_ManHashAnd(p_01,uVar1 ^ (uint)(uVar4 >> 0x1d) & 1,
                                        uVar6 ^ uVar13 >> 0x1d & 1);
              }
              else {
                if (((int)uVar1 < 0) ||
                   (uVar6 = *(uint *)((long)pGVar3 +
                                     lVar23 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3 + 8),
                   (int)uVar6 < 0)) goto LAB_0021ded6;
                iVar15 = Gia_ManHashXor(p_01,uVar1 ^ (uint)(uVar4 >> 0x1d) & 1,
                                        uVar6 ^ uVar13 >> 0x1d & 1);
              }
            }
            else {
              uVar1 = *(uint *)((long)puVar10 + (lVar21 * 4 - (ulong)(uint)(iVar15 * 4)));
              if (uVar1 != 0) {
                uVar17 = (uint)((ulong)-uVar19 + lVar21);
                if (((int)uVar17 < 0) || ((int)uVar22 <= (int)uVar17)) {
LAB_0021df90:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
                }
                if ((((uint)__s[(ulong)-uVar19 + lVar21 >> 5 & 0x7ffffff] >> (uVar17 & 0x1f) & 1) ==
                     0) && (uVar19 = *(uint *)((long)puVar10 +
                                              (lVar21 * 4 - (ulong)((uVar13 & 0x1fffffff) << 2))),
                           uVar19 != 0)) {
                  uVar17 = (uint)((ulong)-uVar16 + lVar21);
                  if (((int)uVar17 < 0) || (uVar22 <= uVar17)) goto LAB_0021df90;
                  if (((uint)__s[(ulong)-uVar16 + lVar21 >> 5 & 0x7ffffff] >> (uVar17 & 0x1f) & 1)
                      == 0) {
                    if (((int)uVar1 < 0) || ((int)uVar19 < 0)) goto LAB_0021df52;
                    if ((uVar1 ^ uVar19) < 2) {
                      pGVar5 = (Gia_Obj_t *)(&pGVar3->field_0x0 + lVar23);
                      pGVar11 = (Gia_Obj_t *)
                                ((long)pGVar5 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3);
                      iVar15 = Gia_ObjFanin2Copy(p,pGVar5);
                      iVar7 = Gia_ObjFanin2Copy(p,pGVar11);
                      iVar8 = Gia_ObjFanin0Copy(pGVar5);
                      iVar15 = Gia_ManHashMux(p_01,iVar15,iVar7,iVar8);
                      iVar7 = Gia_ObjFanin1Copy(pGVar11);
                      iVar8 = Gia_ObjFanin0Copy(pGVar11);
                      iVar7 = Gia_ManHashMux(p_01,iVar15,iVar7,iVar8);
                      iVar8 = Gia_ObjFanin2Copy(p,pGVar5);
                      iVar15 = Gia_ManHashMux(p_01,iVar8,iVar7,iVar15);
                      *(int *)((long)&pGVar3->Value + lVar23) = iVar15;
                      iVar15 = (int)lVar21;
                      Vec_BitWriteEntry(p_00,iVar15 - (*(uint *)(&pGVar3->field_0x0 + lVar23) &
                                                      0x1fffffff),Entry);
                      Vec_BitWriteEntry(p_00,iVar15 - (*(uint *)(&pGVar3->field_0x4 + lVar23) &
                                                      0x1fffffff),Entry_00);
                      Vec_BitWriteEntry(p_00,iVar15,Entry_01);
                      goto LAB_0021dce5;
                    }
                  }
                }
              }
              uVar16 = puVar10[lVar21];
              if ((int)uVar16 < 0) {
LAB_0021df52:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              if ((uint)uVar14 <= uVar16 >> 1) {
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if ((((int)pGVar3[uVar16 >> 1].Value < 0) ||
                  (uVar19 = *(uint *)((long)pGVar3 +
                                     lVar23 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3 + 8),
                  (int)uVar19 < 0)) ||
                 (uVar1 = *(uint *)((long)pGVar3 + lVar23 + (ulong)(uint)(iVar15 << 2) * -3 + 8),
                 (int)uVar1 < 0)) {
LAB_0021ded6:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              iVar15 = Gia_ManHashMux(p_01,pGVar3[uVar16 >> 1].Value ^ uVar16 & 1,
                                      uVar19 ^ uVar13 >> 0x1d & 1,uVar1 ^ uVar6 >> 0x1d & 1);
            }
          }
          else {
            uVar13 = *(uint *)((long)pGVar3 + lVar23 + (ulong)(uint)(iVar15 << 2) * -3 + 8);
            if ((int)uVar13 < 0) goto LAB_0021ded6;
            iVar15 = Gia_ManAppendBuf(p_01,uVar13 ^ uVar6 >> 0x1d & 1);
          }
        }
        else {
          uVar13 = *(uint *)((long)pGVar3 + lVar23 + (ulong)(uint)(iVar15 << 2) * -3 + 8);
          if ((int)uVar13 < 0) goto LAB_0021ded6;
          iVar15 = Gia_ManAppendCo(p_01,uVar13 ^ uVar6 >> 0x1d & 1);
        }
        *(int *)((long)&pGVar3->Value + lVar23) = iVar15;
      }
LAB_0021dce5:
      lVar21 = lVar21 + 1;
      uVar14 = (ulong)p->nObjs;
      lVar23 = lVar23 + 0xc;
    } while (lVar21 < (long)uVar14);
  }
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(p_00);
  Gia_ManHashStop(p_01);
  Gia_ManSetRegNum(p_01,p->nRegs);
  pGVar12 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManMuxRestructure( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Vec_Bit_t * vUsed = Vec_BitStart( Gia_ManObjNum(p) );
    assert( !Gia_ManHasChoices(p) );
    assert( !Gia_ManHasMapping(p) );
    assert( p->pMuxes != NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsMuxId(p, i) && 
                  Gia_ObjIsMuxId(p, Gia_ObjFaninId0(pObj, i)) && !Vec_BitEntry(vUsed, Gia_ObjFaninId0(pObj, i)) && 
                  Gia_ObjIsMuxId(p, Gia_ObjFaninId1(pObj, i)) && !Vec_BitEntry(vUsed, Gia_ObjFaninId1(pObj, i)) &&
                  Gia_ObjFaninId2(p, Gia_ObjFaninId0(pObj, i)) == Gia_ObjFaninId2(p, Gia_ObjFaninId1(pObj, i))  )
        {
            Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
            int Value0 = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin2Copy(p, pFan1), Gia_ObjFanin0Copy(pObj) );
            int Value1 = Gia_ManHashMux( pNew, Value0, Gia_ObjFanin1Copy(pFan1), Gia_ObjFanin0Copy(pFan1) );
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Value1, Value0 );
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0(pObj, i), 1 );
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId1(pObj, i), 1 );
            Vec_BitWriteEntry( vUsed, i, 1 );
            nNodes++;
        }
        else if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Vec_BitFree( vUsed );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}